

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Program.cpp
# Opt level: O0

string * __thiscall
soul::Program::ProgramImpl::getVariableNameWithQualificationIfNeeded_abi_cxx11_
          (string *__return_storage_ptr__,ProgramImpl *this,Module *context,Variable *v)

{
  bool bVar1;
  Module *pMVar2;
  string *psVar3;
  string local_78;
  ArrayView<soul::pool_ref<soul::heart::Variable>_> local_58;
  reference local_48;
  pool_ref<soul::Module> *m;
  const_iterator __end3;
  const_iterator __begin3;
  vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_> *__range3;
  Variable *v_local;
  Module *context_local;
  ProgramImpl *this_local;
  
  bVar1 = heart::Variable::isState(v);
  if (bVar1) {
    __end3 = std::
             vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>::
             begin(&this->modules);
    m = (pool_ref<soul::Module> *)
        std::vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>::
        end(&this->modules);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<const_soul::pool_ref<soul::Module>_*,_std::vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>_>
                                       *)&m), bVar1) {
      local_48 = __gnu_cxx::
                 __normal_iterator<const_soul::pool_ref<soul::Module>_*,_std::vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>_>
                 ::operator*(&__end3);
      pMVar2 = pool_ref<soul::Module>::operator->(local_48);
      local_58 = Module::StateVariables::get(&pMVar2->stateVariables);
      bVar1 = contains<soul::ArrayView<soul::pool_ref<soul::heart::Variable>>,soul::heart::Variable_const&>
                        (&local_58,v);
      if (bVar1) {
        bVar1 = pool_ref<soul::Module>::operator==(local_48,context);
        if (!bVar1) {
          pMVar2 = pool_ref<soul::Module>::operator->(local_48);
          psVar3 = Identifier::operator_cast_to_string_(&v->name);
          TokenisedPathString::join(&local_78,&pMVar2->fullName,psVar3);
          stripRootNamespaceFromQualifiedPath(__return_storage_ptr__,&local_78);
          std::__cxx11::string::~string((string *)&local_78);
          return __return_storage_ptr__;
        }
        psVar3 = Identifier::toString_abi_cxx11_(&v->name);
        std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar3);
        return __return_storage_ptr__;
      }
      __gnu_cxx::
      __normal_iterator<const_soul::pool_ref<soul::Module>_*,_std::vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>_>
      ::operator++(&__end3);
    }
  }
  psVar3 = Identifier::operator_cast_to_string_(&v->name);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar3);
  return __return_storage_ptr__;
}

Assistant:

std::string getVariableNameWithQualificationIfNeeded (const Module& context, const heart::Variable& v) const
    {
        if (v.isState())
        {
            for (auto& m : modules)
            {
                if (contains (m->stateVariables.get(), v))
                {
                    if (m == context)
                        return v.name.toString();

                    return stripRootNamespaceFromQualifiedPath (TokenisedPathString::join (m->fullName, v.name));
                }
            }
        }

        return v.name;
    }